

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

MempoolAcceptResult *
AcceptToMemoryPool(MempoolAcceptResult *__return_storage_ptr__,Chainstate *active_chainstate,
                  CTransactionRef *tx,int64_t accept_time,bool bypass_limits,bool test_accept)

{
  pointer pCVar1;
  CCoinsViewCache *this;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range2;
  COutPoint *hashTx;
  COutPoint *hash;
  long in_FS_OFFSET;
  vector<COutPoint,_std::allocator<COutPoint>_> coins_to_uncache;
  BlockValidationState state_dummy;
  vector<COutPoint,_std::allocator<COutPoint>_> local_378;
  ATMPArgs local_360;
  undefined1 local_320 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  size_type local_2f0;
  undefined1 local_2e8 [248];
  CoinsCachePair *local_1f0;
  CoinsCachePair *local_1e8;
  uint8_t local_1e0;
  direct_or_indirect local_1d0;
  uint local_1b4;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1a8;
  undefined **local_150;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_140;
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_f8;
  _Rb_tree<_270907ca_> local_80;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_50;
  long local_28;
  
  local_360.m_coins_to_uncache = &local_378;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (active_chainstate->m_mempool == (CTxMemPool *)0x0) {
    __assert_fail("active_chainstate.GetMempool() != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x743,
                  "MempoolAcceptResult AcceptToMemoryPool(Chainstate &, const CTransactionRef &, int64_t, bool, bool)"
                 );
  }
  local_360.m_chainparams = (active_chainstate->m_chainman->m_options).chainparams;
  local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (COutPoint *)0x0;
  local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (COutPoint *)0x0;
  local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_360.m_allow_replacement = true;
  local_360.m_allow_sibling_eviction = true;
  local_360.m_package_submission = false;
  local_360.m_package_feerates = false;
  local_360.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = false;
  local_360.m_allow_carveouts = true;
  local_360.m_accept_time = accept_time;
  local_360.m_bypass_limits = bypass_limits;
  local_360.m_test_accept = test_accept;
  anon_unknown.dwarf_12a34eb::MemPoolAccept::MemPoolAccept
            ((MemPoolAccept *)local_320,active_chainstate->m_mempool,active_chainstate);
  anon_unknown.dwarf_12a34eb::MemPoolAccept::AcceptSingleTransaction
            (__return_storage_ptr__,(MemPoolAccept *)local_320,tx,&local_360);
  std::__cxx11::
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::_M_clear(&local_50);
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&local_80);
  local_150 = &PTR_GetCoin_00afe5a8;
  std::
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_f8);
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::allocator<std::pair<const_COutPoint,_Coin>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_140);
  local_320._8_8_ = &PTR_GetCoin_00b033f0;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1a8);
  if (local_1e0 != '\0') {
    (local_1e8->second).m_prev = local_1f0;
    (local_1f0->second).m_next = local_1e8;
    local_1e0 = '\0';
  }
  if (0x1c < local_1b4) {
    free(local_1d0.indirect_contents.indirect);
    local_1d0.indirect_contents.indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)(local_2e8 + 8));
  pCVar1 = local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  hash = local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (__return_storage_ptr__->m_result_type != VALID) {
    for (; hash != pCVar1; hash = hash + 1) {
      this = Chainstate::CoinsTip(active_chainstate);
      CCoinsViewCache::Uncache(this,hash);
    }
  }
  local_320._0_8_ = (CTxMemPool *)0x0;
  local_320._16_8_ = (CCoinsView *)0x0;
  local_308._M_local_buf[0] = false;
  local_2f0 = 0;
  local_2e8[0] = '\0';
  local_320._8_8_ = local_320 + 0x18;
  local_2f8._M_p = local_2e8;
  Chainstate::FlushStateToDisk(active_chainstate,(BlockValidationState *)local_320,PERIODIC,0);
  if (local_2f8._M_p != local_2e8) {
    operator_delete(local_2f8._M_p,CONCAT71(local_2e8._1_7_,local_2e8[0]) + 1);
  }
  if ((undefined1 *)local_320._8_8_ != local_320 + 0x18) {
    operator_delete((void *)local_320._8_8_,
                    CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1);
  }
  if (local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (COutPoint *)0x0) {
    operator_delete(local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

MempoolAcceptResult AcceptToMemoryPool(Chainstate& active_chainstate, const CTransactionRef& tx,
                                       int64_t accept_time, bool bypass_limits, bool test_accept)
{
    AssertLockHeld(::cs_main);
    const CChainParams& chainparams{active_chainstate.m_chainman.GetParams()};
    assert(active_chainstate.GetMempool() != nullptr);
    CTxMemPool& pool{*active_chainstate.GetMempool()};

    std::vector<COutPoint> coins_to_uncache;
    auto args = MemPoolAccept::ATMPArgs::SingleAccept(chainparams, accept_time, bypass_limits, coins_to_uncache, test_accept);
    MempoolAcceptResult result = MemPoolAccept(pool, active_chainstate).AcceptSingleTransaction(tx, args);
    if (result.m_result_type != MempoolAcceptResult::ResultType::VALID) {
        // Remove coins that were not present in the coins cache before calling
        // AcceptSingleTransaction(); this is to prevent memory DoS in case we receive a large
        // number of invalid transactions that attempt to overrun the in-memory coins cache
        // (`CCoinsViewCache::cacheCoins`).

        for (const COutPoint& hashTx : coins_to_uncache)
            active_chainstate.CoinsTip().Uncache(hashTx);
        TRACE2(mempool, rejected,
                tx->GetHash().data(),
                result.m_state.GetRejectReason().c_str()
        );
    }
    // After we've (potentially) uncached entries, ensure our coins cache is still within its size limits
    BlockValidationState state_dummy;
    active_chainstate.FlushStateToDisk(state_dummy, FlushStateMode::PERIODIC);
    return result;
}